

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
::reserve(vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
          *this,size_t n)

{
  PrimarySample *pPVar1;
  iterator pPVar2;
  ulong in_RSI;
  vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
  *in_RDI;
  int i;
  PrimarySample *ra;
  PrimarySample *in_stack_ffffffffffffffc8;
  PrimarySample *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pPVar1 = pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>::
             allocate_object<pbrt::MLTSampler::PrimarySample>
                       ((polymorphic_allocator<pbrt::MLTSampler::PrimarySample> *)
                        in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = pPVar1 + local_1c;
      pPVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>::
      construct<pbrt::MLTSampler::PrimarySample,pbrt::MLTSampler::PrimarySample>
                (&in_RDI->alloc,in_stack_ffffffffffffffd0,pPVar2 + local_1c);
      pPVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>::
      destroy<pbrt::MLTSampler::PrimarySample>(&in_RDI->alloc,pPVar2 + local_1c);
    }
    pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>::
    deallocate_object<pbrt::MLTSampler::PrimarySample>
              ((polymorphic_allocator<pbrt::MLTSampler::PrimarySample> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8,0x78b854);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pPVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }